

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O1

void ext_defs(GlobalVars *gv,FILE *f,LinkedSection *sec,uint8_t bind,uint8_t stype,uint32_t xdeftype
             )

{
  Symbol *pSVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  Symbol *pSVar5;
  undefined1 *puVar6;
  size_t sVar7;
  uint32_t w;
  Symbol *sym;
  
  sym = (Symbol *)(sec->symbols).first;
  pSVar1 = (Symbol *)(sym->n).next;
  if (pSVar1 != (Symbol *)0x0) {
    bVar2 = false;
    do {
      pSVar5 = pSVar1;
      if (((sym->type == stype) && (sym->bind == bind)) && (sym->info < 3)) {
        remnode(&sym->n);
        bVar4 = discard_symbol(gv,sym);
        if (bVar4 == 0) {
          if (xdeftype == 0x100) {
            if ((stype == '\x03') && ((sym->flags & 2) == 0)) {
              error(0x5d,fff_amigahunk.tname,sym->name);
            }
          }
          else {
            if (!bVar2) {
              if (xdeftype == 0) {
                w = 0x3f0;
                puVar6 = &symhunk;
                cVar3 = symhunk;
              }
              else {
                w = 0x3ef;
                puVar6 = &exthunk;
                cVar3 = exthunk;
              }
              if (cVar3 == '\0') {
                *puVar6 = 1;
                fwrite32be(f,w);
              }
            }
            if ((xdeftype == 0) && (sVar7 = strlen(sym->name), 0x7c < sVar7)) {
              fwrite32be(f,0x1f);
              fwritex(f,sym->name,0x7c);
            }
            else {
              sVar7 = strlen(sym->name);
              fwrite32be(f,(int)sVar7 + 3 >> 2 | xdeftype << 0x18);
              hunk_name(f,sym->name);
            }
            fwrite32be(f,(uint32_t)sym->value);
            bVar2 = true;
          }
        }
      }
      pSVar1 = (Symbol *)(pSVar5->n).next;
      sym = pSVar5;
    } while (pSVar1 != (Symbol *)0x0);
  }
  return;
}

Assistant:

static void ext_defs(struct GlobalVars *gv,FILE *f,struct LinkedSection *sec,
                     uint8_t bind,uint8_t stype,uint32_t xdeftype)
{
  struct Symbol *nextsym,*sym=(struct Symbol *)sec->symbols.first;
  bool xdefs = FALSE;

  while (nextsym = (struct Symbol *)sym->n.next) {
    if (sym->type==stype && sym->bind==bind && sym->info<=SYMI_FUNC) {
      remnode(&sym->n);

      if (!discard_symbol(gv,sym)) {
        if (xdeftype != EXT_IGNORE) {
          if (!xdefs) {
            xdefs = TRUE;
            if (xdeftype == EXT_SYMB) {
              if (!symhunk) {
                symhunk = TRUE;
                fwrite32be(f,HUNK_SYMBOL);
              }
            }
            else {
              if (!exthunk) {
                exthunk = TRUE;
                fwrite32be(f,HUNK_EXT);
              }
            }
          }
          /* generate xdef or symbol table entry */
          if (xdeftype==EXT_SYMB && strlen(sym->name)>124) {
            /* LoadSeg<=V40 doesn't allow more than 31 longwords per symbol,
               and will respond with "bad loadfile hunk" otherwise -
               so just strip the rest! */
            fwrite32be(f,(xdeftype << 24) | 31);
            fwritex(f,sym->name,124);
          }
          else {
            fwrite32be(f,(xdeftype << 24) | strlen32(sym->name));
            hunk_name(f,sym->name);           /* write symbol's name */
          }
          fwrite32be(f,(uint32_t)sym->value);  /* ... and its value */
        }

        else { /* EXT_IGNORE */
          if (stype==SYM_COMMON && !(sym->flags & SYMF_REFERENCED))
            /* Warning: unreferenced common symbol will disappear! */
            error(93,fff_amigahunk.tname,sym->name);
        }
      }
    }
    sym = nextsym;
  }
}